

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O3

void __thiscall
LNodeData<LNodeFCStmt>::LNodeData(LNodeData<LNodeFCStmt> *this,LNodeType type,LNodeFCStmt *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->super_LNode).type = type;
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_00121ad8;
  (this->value).name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value).parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (value->name).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->name).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (value->name).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (value->name).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->value).name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (value->parameters).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->parameters).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (value->parameters).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (value->parameters).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->value).parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (value->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value).stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

LNodeData(LNodeType type, T &&value) : LNode(type) {
        this->value = std::move(value);
    }